

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SizeT IA64_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  SizeT in_RAX;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  Byte *pBVar13;
  undefined1 auVar14 [16];
  
  auVar3 = _DAT_0011ca90;
  auVar2 = _DAT_0011ca70;
  if (0xf < size) {
    uVar6 = 0;
    pBVar13 = data;
    do {
      in_RAX = (SizeT)(data[uVar6] & 0x1f);
      bVar1 = ""[in_RAX];
      uVar9 = 5;
      uVar11 = 0;
      do {
        if ((bVar1 >> (uVar11 & 0x1f) & 1) != 0) {
          pbVar10 = pBVar13 + (uVar9 >> 3);
          lVar5 = 0;
          in_RAX = 0;
          pbVar7 = pbVar10;
          do {
            in_RAX = in_RAX + ((ulong)*pbVar7 << ((byte)lVar5 & 0x3f));
            pbVar7 = pbVar7 + 1;
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x30);
          bVar4 = (byte)uVar9 & 7;
          uVar8 = in_RAX >> bVar4;
          if ((uVar8 & 0x1e000000e00) == 0xa000000000) {
            uVar12 = ((uint)(uVar8 >> 0x10) & 0x100000 | (uint)(uVar8 >> 0xd) & 0xfffff) * 0x10 -
                     (int)uVar6 >> 4;
            uVar8 = ((ulong)(uVar12 & 0x100000) << 0x10 |
                    (ulong)(uVar12 & 0xfffff) << 0xd | uVar8 & 0xfffffeae000011ff) << bVar4 |
                    (ulong)((uint)in_RAX & ~(-1 << bVar4));
            in_RAX = 8;
            auVar14 = auVar2;
            do {
              if (SUB164(auVar14 ^ auVar3,4) == -0x80000000 &&
                  SUB164(auVar14 ^ auVar3,0) < -0x7ffffffa) {
                *pbVar10 = (byte)(uVar8 >> ((byte)in_RAX - 8 & 0x3f));
                pbVar10[1] = (byte)(uVar8 >> ((byte)in_RAX & 0x3f));
              }
              lVar5 = auVar14._8_8_;
              auVar14._0_8_ = auVar14._0_8_ + 2;
              auVar14._8_8_ = lVar5 + 2;
              in_RAX = in_RAX + 0x10;
              pbVar10 = pbVar10 + 2;
            } while (in_RAX != 0x38);
          }
        }
        uVar11 = uVar11 + 1;
        uVar9 = uVar9 + 0x29;
      } while (uVar11 != 3);
      uVar6 = uVar6 + 0x10;
      pBVar13 = pBVar13 + 0x10;
    } while (uVar6 <= size - 0x10);
  }
  return in_RAX;
}

Assistant:

static SizeT IA64_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 16)
    return 0;
  size -= 16;
  for (i = 0; i <= size; i += 16)
  {
    UInt32 instrTemplate = data[i] & 0x1F;
    UInt32 mask = kBranchTable[instrTemplate];
    UInt32 bitPos = 5;
    int slot;
    for (slot = 0; slot < 3; slot++, bitPos += 41)
    {
      UInt32 bytePos, bitRes;
      UInt64 instruction, instNorm;
      int j;
      if (((mask >> slot) & 1) == 0)
        continue;
      bytePos = (bitPos >> 3);
      bitRes = bitPos & 0x7;
      instruction = 0;
      for (j = 0; j < 6; j++)
        instruction += (UInt64)data[i + j + bytePos] << (8 * j);

      instNorm = instruction >> bitRes;
      if (((instNorm >> 37) & 0xF) == 0x5 && ((instNorm >> 9) & 0x7) == 0)
      {
        UInt32 src = (UInt32)((instNorm >> 13) & 0xFFFFF);
        UInt32 dest;
        src |= ((UInt32)(instNorm >> 36) & 1) << 20;
        
        src <<= 4;
        
        if (encoding)
          dest = ip + (UInt32)i + src;
        else
          dest = src - (ip + (UInt32)i);
        
        dest >>= 4;
        
        instNorm &= ~((UInt64)(0x8FFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0xFFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0x100000) << (36 - 20));
        
        instruction &= (1 << bitRes) - 1;
        instruction |= (instNorm << bitRes);
        for (j = 0; j < 6; j++)
          data[i + j + bytePos] = (Byte)(instruction >> (8 * j));
      }
    }
  }
  return i;
}